

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ResolveModule(JSContext *ctx,JSValue obj)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((int)obj.tag == -3) {
    iVar1 = js_resolve_module(ctx,(JSModuleDef *)obj.u.ptr);
    if (iVar1 < 0) {
      js_free_modules(ctx,JS_FREE_MODULE_NOT_RESOLVED);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int JS_ResolveModule(JSContext *ctx, JSValueConst obj)
{
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
        JSModuleDef *m = JS_VALUE_GET_PTR(obj);
        // printf("%s\n",JS_AtomToCString(ctx,m->module_name));
        if (js_resolve_module(ctx, m) < 0) {
            js_free_modules(ctx, JS_FREE_MODULE_NOT_RESOLVED);
            return -1;
        }
    }
    return 0;
}